

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::WrapOpKill::GetVoidTypeId(WrapOpKill *this)

{
  IRContext *this_00;
  uint32_t uVar1;
  Type local_48;
  
  uVar1 = *(uint32_t *)&(this->super_Pass).field_0x34;
  if (uVar1 == 0) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(this_00);
    }
    local_48.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_48._28_8_ = 0;
    local_48.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    local_48.decorations_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    local_48._vptr_Type = (_func_int **)&PTR__Type_003ea9a0;
    uVar1 = analysis::TypeManager::GetTypeInstruction
                      ((this_00->type_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                       _M_head_impl,&local_48);
    *(uint32_t *)&(this->super_Pass).field_0x34 = uVar1;
    local_48._vptr_Type = (_func_int **)&PTR__Type_003e9e18;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_48.decorations_);
  }
  return uVar1;
}

Assistant:

uint32_t WrapOpKill::GetVoidTypeId() {
  if (void_type_id_ != 0) {
    return void_type_id_;
  }

  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Void void_type;
  void_type_id_ = type_mgr->GetTypeInstruction(&void_type);
  return void_type_id_;
}